

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::UniformBlockCase::iterate(UniformBlockCase *this)

{
  deUint32 *pdVar1;
  DataType dataType;
  TestLog *log;
  UniformBlock *pUVar2;
  _Base_ptr p_Var3;
  pointer ppUVar4;
  RenderContext *renderCtx;
  mapped_type pvVar5;
  code *pcVar6;
  pointer puVar7;
  pointer pBVar8;
  pointer pUVar9;
  int iVar10;
  DataType DVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  deUint32 dVar15;
  undefined4 extraout_var;
  pointer pBVar17;
  mapped_type *ppvVar18;
  const_iterator cVar19;
  char *pcVar20;
  ostream *poVar21;
  mapped_type_conflict *pmVar22;
  int i;
  uint uVar23;
  deUint32 dVar24;
  int iVar25;
  ulong uVar26;
  size_t __n;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar27;
  undefined8 extraout_RDX_02;
  void *__buf;
  void *__buf_00;
  int blockNdx_2;
  deUint32 binding_1;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  size_type __n_00;
  undefined1 isVertex;
  uint uVar31;
  ulong in_R9;
  pointer pUVar32;
  long lVar33;
  vector<int,_std::allocator<int>_> *this_00;
  int blockNdx;
  ulong uVar34;
  long lVar35;
  undefined8 *puVar36;
  bool bVar37;
  bool bVar38;
  int numActiveUniforms;
  vector<char,_std::allocator<char>_> nameBuf;
  int numActiveBlocks;
  ShaderInterface *local_768;
  int nameLen;
  undefined4 uStack_75c;
  pointer local_758;
  UniformLayout glLayout;
  deUint32 type;
  int size_1;
  GLsizei nameLen_1;
  UniformBufferManager bufferManager;
  UniformLayout refLayout;
  vector<int,_std::allocator<int>_> blockIndices;
  int numBlockUniforms;
  ulong local_680;
  ulong local_678;
  long local_670;
  ulong local_668;
  int local_660;
  int local_65c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<char,_std::allocator<char>_> nameBuf_1;
  vector<int,_std::allocator<int>_> rowMajorFlags;
  vector<int,_std::allocator<int>_> matrixStrides;
  vector<int,_std::allocator<int>_> arrayStrides;
  vector<int,_std::allocator<int>_> offsets;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> blockPointers;
  Random rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  _Alloc_hider local_558;
  pointer local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_548 [21];
  ShaderProgram program;
  ostringstream vtxSrc;
  ostringstream fragSrc;
  long lVar16;
  
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar16 = CONCAT44(extraout_var,iVar10);
  refLayout.uniforms.
  super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  refLayout.uniforms.
  super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  blockPointers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &blockPointers._M_t._M_impl.super__Rb_tree_header._M_header;
  blockPointers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  refLayout.blocks.
  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  refLayout.uniforms.
  super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blockPointers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  refLayout.blocks.
  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  refLayout.blocks.
  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar34 = 0;
  blockPointers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       blockPointers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  local_768 = &this->m_interface;
  uVar26 = (ulong)((long)(this->m_interface).m_uniformBlocks.
                         super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_interface).m_uniformBlocks.
                        super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  local_680 = uVar26 & 0xffffffff;
  if ((int)uVar26 < 1) {
    local_680 = uVar34;
  }
  while (uVar34 != local_680) {
    pUVar2 = (this->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar34];
    if (((pUVar2->m_instanceName)._M_string_length == 0) ||
       ((pUVar2->m_instanceName)._M_dataplus._M_p == (pointer)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vtxSrc,glcts::fixed_sample_locations_values + 1,(allocator<char> *)&rnd)
      ;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rnd,(pUVar2->m_blockName)._M_dataplus._M_p,(allocator<char> *)&fragSrc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtxSrc,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,".");
      std::__cxx11::string::~string((string *)&rnd);
    }
    glLayout.blocks.
    super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)glLayout.blocks.
                          super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    uVar26 = (long)refLayout.blocks.
                   super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)refLayout.blocks.
                   super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    local_668 = (ulong)((long)refLayout.uniforms.
                              super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)refLayout.uniforms.
                             super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6;
    for (pUVar32 = (pUVar2->m_uniforms).
                   super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pUVar32 !=
        (pUVar2->m_uniforms).
        super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>._M_impl.
        super__Vector_impl_data._M_finish; pUVar32 = pUVar32 + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtxSrc,
                     (pUVar32->m_name)._M_dataplus._M_p);
      uVar31 = pUVar32->m_flags;
      uVar23 = uVar31;
      if ((uVar31 & 0x38) == 0) {
        uVar23 = pUVar2->m_flags;
      }
      if ((uVar31 & 0xc0) == 0) {
        uVar31 = pUVar2->m_flags;
      }
      uVar31 = uVar31 & 0xc0 | uVar23 & 0x38;
      in_R9 = (ulong)uVar31;
      ub::anon_unknown_12::computeStd140Layout
                (&refLayout,(int *)&glLayout,(int)(uVar26 >> 6),(string *)&rnd,&pUVar32->m_type,
                 uVar31);
      std::__cxx11::string::~string((string *)&rnd);
    }
    uVar26 = (long)refLayout.uniforms.
                   super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)refLayout.uniforms.
                   super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    local_670 = CONCAT44(local_670._4_4_,
                         glLayout.blocks.
                         super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
    iVar10 = pUVar2->m_arraySize;
    if (iVar10 < 2) {
      iVar10 = 1;
    }
    local_678 = uVar34;
    for (nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start._0_4_ = 0;
        (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start < iVar10;
        nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ =
             (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + 1) {
      rnd.m_rnd._0_8_ = &local_568;
      rnd.m_rnd.z = 0;
      rnd.m_rnd.w = 0;
      local_568._M_allocated_capacity = local_568._M_allocated_capacity & 0xffffffffffffff00;
      local_558._M_p = local_558._M_p & 0xffffffff00000000;
      local_550 = (pointer)0x0;
      aaStack_548[0]._M_allocated_capacity = (pointer)0x0;
      aaStack_548[0]._8_8_ = (pointer)0x0;
      std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
      ::emplace_back<deqp::gls::ub::BlockLayoutEntry>(&refLayout.blocks,(BlockLayoutEntry *)&rnd);
      ub::BlockLayoutEntry::~BlockLayoutEntry((BlockLayoutEntry *)&rnd);
      pBVar8 = refLayout.blocks.
               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pBVar17 = refLayout.blocks.
                super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      std::__cxx11::string::assign((char *)pBVar17);
      pBVar8[-1].size = (int)local_670;
      uVar34 = local_668;
      while( true ) {
        rnd.m_rnd.x = (deUint32)uVar34;
        if ((int)(uVar26 >> 6) <= (int)(deUint32)uVar34) break;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&pBVar8[-1].activeUniformIndices,(value_type_conflict1 *)&rnd);
        uVar34 = (ulong)(rnd.m_rnd.x + 1);
      }
      if (0 < pUVar2->m_arraySize) {
        de::toString<int>((string *)&program,(int *)&nameBuf);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fragSrc
                       ,"[",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &program);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fragSrc
                       ,"]");
        std::__cxx11::string::append((string *)pBVar17);
        std::__cxx11::string::~string((string *)&rnd);
        std::__cxx11::string::~string((string *)&fragSrc);
        std::__cxx11::string::~string((string *)&program);
      }
    }
    std::__cxx11::string::~string((string *)&vtxSrc);
    uVar34 = local_678 + 1;
  }
  iVar10 = 0;
  for (pBVar17 = refLayout.blocks.
                 super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pBVar17 !=
      refLayout.blocks.
      super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish; pBVar17 = pBVar17 + 1) {
    iVar10 = iVar10 + pBVar17->size;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&data,(long)iVar10);
  dVar24 = 0;
  iVar10 = 0;
  while( true ) {
    puVar7 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    rnd.m_rnd.x = dVar24;
    if ((int)((ulong)((long)refLayout.blocks.
                            super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)refLayout.blocks.
                           super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) <= (int)dVar24) break;
    ppvVar18 = std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               ::operator[](&blockPointers,(key_type_conflict *)&rnd);
    *ppvVar18 = puVar7 + iVar10;
    dVar24 = rnd.m_rnd.x + 1;
    iVar10 = iVar10 + refLayout.blocks.
                      super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)rnd.m_rnd.x].size;
  }
  deRandom_init(&rnd.m_rnd,1);
  uVar26 = (long)refLayout.blocks.
                 super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)refLayout.blocks.
                 super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ = 0;
  do {
    if ((int)(uVar26 >> 6) <=
        (int)(uint)vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtxSrc);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragSrc);
      pcVar20 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
      poVar21 = std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,pcVar20);
      std::operator<<(poVar21,"\n");
      std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "in highp vec4 a_position;\n");
      std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "out mediump float v_vtxResult;\n");
      std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
      rnd.m_rnd.x = 0;
      rnd.m_rnd.y = 0;
      rnd.m_rnd.z = 0;
      rnd.m_rnd.w = 0;
      local_568._M_allocated_capacity = 0;
      ub::ShaderInterface::getNamedStructs
                (local_768,
                 (vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
                  *)&rnd);
      uVar27 = extraout_RDX;
      for (puVar36 = (undefined8 *)rnd.m_rnd._0_8_; puVar36 != (undefined8 *)rnd.m_rnd._8_8_;
          puVar36 = puVar36 + 1) {
        ub::anon_unknown_12::generateDeclaration(&vtxSrc,(StructType *)*puVar36,(int)uVar27);
        uVar27 = extraout_RDX_00;
      }
      for (lVar33 = 0;
          ppUVar4 = (this->m_interface).m_uniformBlocks.
                    super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          lVar33 < (int)((ulong)((long)(this->m_interface).m_uniformBlocks.
                                       super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppUVar4)
                        >> 3); lVar33 = lVar33 + 1) {
        pUVar2 = ppUVar4[lVar33];
        if ((pUVar2->m_flags & 0x100) != 0) {
          ub::anon_unknown_12::generateDeclaration(&vtxSrc,pUVar2);
        }
      }
      std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
      ub::anon_unknown_12::generateCompareFuncs
                (&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,local_768);
      std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tmediump float result = 1.0;\n"
                     );
      ub::anon_unknown_12::generateCompareSrc
                (&vtxSrc,(char *)local_768,(ShaderInterface *)&refLayout,
                 (UniformLayout *)&blockPointers,
                 (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *
                 )&DAT_00000001,SUB81(in_R9,0));
      std::operator<<(&vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "\tv_vtxResult = result;\n}\n");
      std::
      _Vector_base<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
      ::~_Vector_base((_Vector_base<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
                       *)&rnd);
      pcVar20 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
      poVar21 = std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,pcVar20)
      ;
      std::operator<<(poVar21,"\n");
      std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "in mediump float v_vtxResult;\n");
      std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
      std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
      rnd.m_rnd.x = 0;
      rnd.m_rnd.y = 0;
      rnd.m_rnd.z = 0;
      rnd.m_rnd.w = 0;
      local_568._M_allocated_capacity = 0;
      ub::ShaderInterface::getNamedStructs
                (local_768,
                 (vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
                  *)&rnd);
      uVar27 = extraout_RDX_01;
      for (puVar36 = (undefined8 *)rnd.m_rnd._0_8_; puVar36 != (undefined8 *)rnd.m_rnd._8_8_;
          puVar36 = puVar36 + 1) {
        ub::anon_unknown_12::generateDeclaration(&fragSrc,(StructType *)*puVar36,(int)uVar27);
        uVar27 = extraout_RDX_02;
      }
      lVar33 = 0;
      while( true ) {
        isVertex = (undefined1)in_R9;
        ppUVar4 = (this->m_interface).m_uniformBlocks.
                  super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(this->m_interface).m_uniformBlocks.
                                super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppUVar4) >> 3) <=
            lVar33) break;
        pUVar2 = ppUVar4[lVar33];
        if ((pUVar2->m_flags & 0x200) != 0) {
          ub::anon_unknown_12::generateDeclaration(&fragSrc,pUVar2);
        }
        lVar33 = lVar33 + 1;
      }
      std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
      ub::anon_unknown_12::generateCompareFuncs
                (&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,local_768);
      std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "\nvoid main (void)\n{\n\tmediump float result = 1.0;\n");
      ub::anon_unknown_12::generateCompareSrc
                (&fragSrc,(char *)local_768,(ShaderInterface *)&refLayout,
                 (UniformLayout *)&blockPointers,
                 (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *
                 )0x0,(bool)isVertex);
      std::operator<<(&fragSrc.super_basic_ostream<char,_std::char_traits<char>_>,
                      "\tdEQP_FragColor = vec4(1.0, v_vtxResult, result, 1.0);\n}\n");
      std::
      _Vector_base<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
      ::~_Vector_base((_Vector_base<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
                       *)&rnd);
      renderCtx = this->m_renderCtx;
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      glu::makeVtxFragSources((ProgramSources *)&rnd,(string *)&glLayout,(string *)&nameBuf);
      glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&rnd);
      glu::ProgramSources::~ProgramSources((ProgramSources *)&rnd);
      std::__cxx11::string::~string((string *)&nameBuf);
      std::__cxx11::string::~string((string *)&glLayout);
      glu::operator<<(log,&program);
      dVar24 = program.m_program.m_program;
      if (program.m_program.m_info.linkOk == false) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Compile failed");
      }
      else {
        glLayout.uniforms.
        super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        glLayout.uniforms.
        super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        glLayout.blocks.
        super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        glLayout.uniforms.
        super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        glLayout.blocks.
        super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        glLayout.blocks.
        super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        numActiveBlocks = 0;
        (**(code **)(lVar16 + 0x9d8))(program.m_program.m_program,0x8b86);
        (**(code **)(lVar16 + 0x9d8))(dVar24,0x8a36,&numActiveBlocks);
        dVar15 = (**(code **)(lVar16 + 0x800))();
        __n = 0x497;
        glu::checkError(dVar15,"Failed to get number of uniforms and uniform blocks",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                        ,0x497);
        std::
        vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
        resize(&glLayout.blocks,(long)numActiveBlocks);
        lVar33 = 0x28;
        for (uVar26 = 0;
            pBVar17 = glLayout.blocks.
                      super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            (long)uVar26 < (long)numActiveBlocks; uVar26 = uVar26 + 1) {
          (**(code **)(lVar16 + 0x760))(dVar24,uVar26 & 0xffffffff,0x8a40,&bufferManager);
          (**(code **)(lVar16 + 0x760))(dVar24,uVar26 & 0xffffffff,0x8a41,&nameLen);
          (**(code **)(lVar16 + 0x760))(dVar24,uVar26 & 0xffffffff,0x8a42,&numBlockUniforms);
          dVar15 = (**(code **)(lVar16 + 0x800))();
          glu::checkError(dVar15,"Uniform block query failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                          ,0x4a6);
          __n_00 = (size_type)(uint)nameLen;
          if (nameLen < 2) {
            __n_00 = 1;
          }
          std::vector<char,_std::allocator<char>_>::vector(&nameBuf,__n_00,(allocator_type *)&rnd);
          (**(code **)(lVar16 + 0x758))
                    (dVar24,uVar26 & 0xffffffff,
                     (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&rnd,
                     (char *)CONCAT44(nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl.super__Vector_impl_data._M_start),
                     (allocator<char> *)&blockIndices);
          std::__cxx11::string::operator=((string *)((long)pBVar17 + lVar33 + -0x28),(string *)&rnd)
          ;
          std::__cxx11::string::~string((string *)&rnd);
          this_00 = (vector<int,_std::allocator<int>_> *)
                    ((long)&(pBVar17->name)._M_dataplus._M_p + lVar33);
          *(undefined4 *)((long)pBVar17 + lVar33 + -8) = bufferManager.m_renderCtx._0_4_;
          std::vector<int,_std::allocator<int>_>::resize(this_00,(long)numBlockUniforms);
          if (0 < numBlockUniforms) {
            (**(code **)(lVar16 + 0x760))
                      (dVar24,uVar26 & 0xffffffff,0x8a43,
                       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start);
          }
          dVar15 = (**(code **)(lVar16 + 0x800))();
          __n = 0x4b3;
          glu::checkError(dVar15,"Uniform block query failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                          ,0x4b3);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&nameBuf.super__Vector_base<char,_std::allocator<char>_>);
          lVar33 = lVar33 + 0x40;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nameBuf,"ActiveUniformBlocks",(allocator<char> *)&nameLen);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bufferManager,"Active Uniform Blocks",
                   (allocator<char> *)&numBlockUniforms);
        tcu::LogSection::LogSection((LogSection *)&rnd,(string *)&nameBuf,(string *)&bufferManager);
        tcu::LogSection::write((LogSection *)&rnd,(int)log,__buf,__n);
        tcu::LogSection::~LogSection((LogSection *)&rnd);
        std::__cxx11::string::~string((string *)&bufferManager);
        std::__cxx11::string::~string((string *)&nameBuf);
        pdVar1 = &rnd.m_rnd.z;
        lVar33 = 0;
        for (lVar28 = 0;
            lVar28 < (int)((ulong)((long)glLayout.blocks.
                                         super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)glLayout.blocks.
                                        super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 6);
            lVar28 = lVar28 + 1) {
          rnd.m_rnd._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
          std::ostream::operator<<(pdVar1,(int)lVar28);
          std::operator<<((ostream *)pdVar1,": ");
          ub::operator<<((ostream *)pdVar1,
                         (BlockLayoutEntry *)
                         ((long)&((glLayout.blocks.
                                   super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                 _M_p + lVar33));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
          lVar33 = lVar33 + 0x40;
        }
        tcu::TestLog::endSection(log);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nameBuf,"ActiveUniforms",(allocator<char> *)&nameLen);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bufferManager,"Active Uniforms",(allocator<char> *)&numBlockUniforms);
        tcu::LogSection::LogSection((LogSection *)&rnd,(string *)&nameBuf,(string *)&bufferManager);
        tcu::LogSection::write((LogSection *)&rnd,(int)log,__buf_00,__n);
        tcu::LogSection::~LogSection((LogSection *)&rnd);
        std::__cxx11::string::~string((string *)&bufferManager);
        std::__cxx11::string::~string((string *)&nameBuf);
        pdVar1 = &rnd.m_rnd.z;
        lVar33 = 0;
        for (lVar28 = 0;
            lVar28 < (int)((ulong)((long)glLayout.uniforms.
                                         super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)glLayout.uniforms.
                                        super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 6);
            lVar28 = lVar28 + 1) {
          rnd.m_rnd._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
          std::ostream::operator<<(pdVar1,(int)lVar28);
          std::operator<<((ostream *)pdVar1,": ");
          ub::operator<<((ostream *)pdVar1,
                         (UniformLayoutEntry *)
                         ((long)&((glLayout.uniforms.
                                   super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                 _M_p + lVar33));
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
          lVar33 = lVar33 + 0x40;
        }
        tcu::TestLog::endSection(log);
        bVar37 = checkLayoutIndices(this,&glLayout);
        if (((bVar37) && (bVar37 = checkLayoutBounds(this,&glLayout), bVar37)) &&
           (bVar37 = compareTypes(this,&refLayout,&glLayout), bVar37)) {
          bVar37 = compareStd140Blocks(this,&refLayout,&glLayout);
          if (!bVar37) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                       "Invalid std140 layout");
          }
          bVar37 = compareSharedBlocks(this,&refLayout,&glLayout);
          if (!bVar37) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                       "Invalid shared layout");
          }
          bVar37 = checkIndexQueries(this,program.m_program.m_program,&glLayout);
          if (!bVar37) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                       "Inconsintent block index query results");
          }
          (**(code **)(lVar16 + 0x1680))(program.m_program.m_program);
          for (iVar10 = 0;
              iVar10 < (int)((ulong)((long)glLayout.blocks.
                                           super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)glLayout.blocks.
                                          super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 6);
              iVar10 = iVar10 + 1) {
            (**(code **)(lVar16 + 0x15d0))(program.m_program.m_program,iVar10,iVar10);
          }
          dVar24 = (**(code **)(lVar16 + 0x800))();
          glu::checkError(dVar24,"Failed to set uniform block bindings",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                          ,0x5cf);
          bufferManager.m_renderCtx = this->m_renderCtx;
          bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar26 = (ulong)((long)glLayout.blocks.
                                 super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)glLayout.blocks.
                                super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 6;
          iVar10 = (int)uVar26;
          local_568._8_8_ = pdVar1;
          if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&nameBuf,(long)iVar10,(allocator_type *)&rnd);
            rnd.m_rnd._8_8_ = rnd.m_rnd._8_8_ & 0xffffffff00000000;
            local_568._M_allocated_capacity = 0;
            local_550 = (pointer)0x0;
            local_558._M_p = (pointer)pdVar1;
            for (nameLen = 0; nameLen < iVar10; nameLen = nameLen + 1) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)nameLen * 0x18 +
                         CONCAT44(nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start)),
                         (long)glLayout.blocks.
                               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start[nameLen].size);
              pvVar5 = *(mapped_type *)
                        (CONCAT44(nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start) +
                        (long)nameLen * 0x18);
              ppvVar18 = std::
                         map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                         ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                       *)&rnd,&nameLen);
              *ppvVar18 = pvVar5;
            }
            ub::anon_unknown_12::copyUniformData
                      (&glLayout,
                       (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                        *)&rnd,&refLayout,&blockPointers);
            uVar34 = 0;
            uVar29 = 0;
            if (0 < iVar10) {
              uVar29 = uVar26 & 0xffffffff;
            }
            lVar33 = 8;
            for (; uVar29 != uVar34; uVar34 = uVar34 + 1) {
              dVar24 = ub::UniformBufferManager::allocBuffer(&bufferManager);
              (**(code **)(lVar16 + 0x40))(0x8a11,dVar24);
              lVar28 = *(long *)(CONCAT44(nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (int)nameBuf.
                                               super__Vector_base<char,_std::allocator<char>_>.
                                               _M_impl.super__Vector_impl_data._M_start) + -8 +
                                lVar33);
              (**(code **)(lVar16 + 0x150))
                        (0x8a11,*(long *)(CONCAT44(nameBuf.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (int)nameBuf.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) + lVar33
                                         ) - lVar28,lVar28,0x88e4);
              dVar15 = (**(code **)(lVar16 + 0x800))();
              glu::checkError(dVar15,"Failed to upload uniform buffer data",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                              ,0x5e8);
              (**(code **)(lVar16 + 0x48))(0x8a11,uVar34 & 0xffffffff,dVar24);
              dVar24 = (**(code **)(lVar16 + 0x800))();
              glu::checkError(dVar24,"glBindBufferBase(GL_UNIFORM_BUFFER) failed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                              ,0x5eb);
              lVar33 = lVar33 + 0x18;
            }
            std::
            _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                         *)&rnd);
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&nameBuf);
          }
          else {
            numBlockUniforms = 0;
            rnd.m_rnd._8_8_ = rnd.m_rnd._8_8_ & 0xffffffff00000000;
            local_568._M_allocated_capacity = 0;
            local_550 = (pointer)0x0;
            local_558._M_p = (pointer)pdVar1;
            (**(code **)(lVar16 + 0x868))(0x8a34);
            iVar13 = 0;
            for (nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_ = 0;
                (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start < iVar10;
                nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ =
                     (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start + 1) {
              if ((0 < numBlockUniforms) &&
                 ((iVar13 / numBlockUniforms) * numBlockUniforms != iVar13)) {
                iVar13 = (iVar13 / numBlockUniforms + 1) * numBlockUniforms;
              }
              pmVar22 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&rnd,(key_type_conflict *)&nameBuf);
              *pmVar22 = iVar13;
              iVar13 = iVar13 + glLayout.blocks.
                                super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start
                                [(int)nameBuf.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start].size;
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nameLen,
                       (long)iVar13,(allocator_type *)&nameBuf);
            nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = 0;
            nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            for (blockIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_ = 0;
                (int)blockIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start < iVar10;
                blockIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ =
                     (int)blockIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 1) {
              pmVar22 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&rnd,(key_type_conflict *)&blockIndices);
              iVar13 = *pmVar22;
              lVar33 = CONCAT44(uStack_75c,nameLen);
              ppvVar18 = std::
                         map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                         ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                       *)&nameBuf,(key_type_conflict *)&blockIndices);
              *ppvVar18 = (mapped_type)(lVar33 + iVar13);
            }
            ub::anon_unknown_12::copyUniformData
                      (&glLayout,
                       (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                        *)&nameBuf,&refLayout,&blockPointers);
            dVar24 = ub::UniformBufferManager::allocBuffer(&bufferManager);
            (**(code **)(lVar16 + 0x40))(0x8a11,dVar24);
            puVar7 = (pointer)CONCAT44(uStack_75c,nameLen);
            if (puVar7 != local_758) {
              (**(code **)(lVar16 + 0x150))(0x8a11,(long)local_758 - (long)puVar7,puVar7,0x88e4);
            }
            dVar15 = (**(code **)(lVar16 + 0x800))();
            glu::checkError(dVar15,"Failed to upload uniform buffer data",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                            ,0x615);
            iVar13 = 0;
            while (blockIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start._0_4_ = iVar13, iVar13 < iVar10) {
              pcVar6 = *(code **)(lVar16 + 0x50);
              pmVar22 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&rnd,(key_type_conflict *)&blockIndices);
              (*pcVar6)(0x8a11,iVar13,dVar24,(long)*pmVar22,
                        (long)glLayout.blocks.
                              super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start
                              [(int)blockIndices.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start].size);
              dVar15 = (**(code **)(lVar16 + 0x800))();
              glu::checkError(dVar15,"glBindBufferRange(GL_UNIFORM_BUFFER) failed",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                              ,0x61c);
              iVar13 = (int)blockIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 1;
            }
            std::
            _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                         *)&nameBuf);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&nameLen);
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&rnd);
          }
          bVar37 = render(this,program.m_program.m_program);
          if (!bVar37) {
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                       "Image compare failed");
          }
          ub::UniformBufferManager::~UniformBufferManager(&bufferManager);
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                     "Invalid layout");
        }
        ub::UniformLayout::~UniformLayout(&glLayout);
      }
      glu::ShaderProgram::~ShaderProgram(&program);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragSrc);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtxSrc);
      std::
      _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
      ::~_Rb_tree(&blockPointers._M_t);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ub::UniformLayout::~UniformLayout(&refLayout);
      return STOP;
    }
    cVar19 = std::
             _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
             ::find(&blockPointers._M_t,(key_type_conflict *)&vtxSrc);
    p_Var3 = cVar19._M_node[1]._M_parent;
    uVar34 = (ulong)(int)(uint)vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream;
    uVar29 = (ulong)((long)refLayout.blocks.
                           super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar34].activeUniformIndices.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)refLayout.blocks.
                          super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar34].activeUniformIndices.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar30 = uVar29 & 0xffffffff;
    if ((int)uVar29 < 1) {
      uVar30 = 0;
    }
    for (uVar29 = 0;
        pUVar9 = refLayout.uniforms.
                 super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start, uVar29 != uVar30; uVar29 = uVar29 + 1) {
      iVar10 = refLayout.blocks.
               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar34].activeUniformIndices.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar29];
      DVar11 = glu::getDataTypeScalarType
                         (refLayout.uniforms.
                          super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar10].type);
      iVar12 = glu::getDataTypeScalarSize(pUVar9[iVar10].type);
      dataType = pUVar9[iVar10].type;
      bVar37 = dataType - TYPE_FLOAT_MAT2 < 9;
      bVar38 = dataType - TYPE_DOUBLE_MAT2 < 9;
      iVar13 = 1;
      local_678 = CONCAT71(local_678._1_7_,bVar38 || bVar37);
      if (bVar38 || bVar37) {
        if (pUVar9[iVar10].isRowMajor == true) {
          iVar13 = glu::getDataTypeMatrixNumRows(dataType);
        }
        else {
          iVar13 = glu::getDataTypeMatrixNumColumns(dataType);
        }
      }
      uVar34 = (long)iVar12 / (long)iVar13 & 0xffffffff;
      iVar14 = pUVar9[iVar10].size;
      iVar25 = 0;
      if ((int)((long)iVar12 / (long)iVar13) < 1) {
        uVar34 = 0;
      }
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      local_668 = CONCAT44(local_668._4_4_,iVar13);
      local_680 = uVar29;
      local_660 = iVar14;
      while (iVar25 < iVar14) {
        iVar13 = pUVar9[iVar10].arrayStride * iVar25;
        iVar12 = 0;
        if (local_660 < 2) {
          iVar13 = 0;
        }
        local_670 = (long)&p_Var3->_M_color + (long)iVar13 + (long)pUVar9[iVar10].offset;
        local_65c = iVar25;
        for (; iVar12 != (int)local_668; iVar12 = iVar12 + 1) {
          lVar33 = (long)(pUVar9[iVar10].matrixStride * iVar12);
          if ((char)local_678 == '\0') {
            lVar33 = 0;
          }
          lVar33 = lVar33 + local_670;
          for (lVar28 = 0; uVar34 * 4 != lVar28; lVar28 = lVar28 + 4) {
            lVar35 = (long)(int)lVar28;
            if (DVar11 == TYPE_BOOL) {
              bVar37 = de::Random::getBool((Random *)&rnd.m_rnd);
              uVar31 = 0;
              if (bVar37) {
                dVar24 = deRandom_getUint32(&rnd.m_rnd);
                uVar31 = dVar24 | 1;
              }
              *(uint *)(lVar33 + lVar35) = uVar31;
            }
            else {
              if (DVar11 == TYPE_INT) {
                dVar24 = deRandom_getUint32(&rnd.m_rnd);
                uVar31 = dVar24 % 0x13 - 9;
              }
              else {
                if (DVar11 != TYPE_UINT) {
                  if (DVar11 == TYPE_FLOAT) {
                    dVar24 = deRandom_getUint32(&rnd.m_rnd);
                    *(float *)(lVar33 + lVar35) = (float)(int)(dVar24 % 0x13 - 9);
                  }
                  goto LAB_014e4183;
                }
                dVar24 = deRandom_getUint32(&rnd.m_rnd);
                uVar31 = dVar24 % 10;
              }
              *(uint *)(lVar33 + lVar35) = uVar31;
            }
LAB_014e4183:
          }
          uVar29 = local_680;
        }
        iVar14 = pUVar9[iVar10].size;
        iVar25 = local_65c + 1;
      }
      uVar34 = (ulong)(uint)vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream;
    }
    vtxSrc.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_4_ =
         (int)uVar34 + 1;
  } while( true );
}

Assistant:

UniformBlockCase::IterateResult UniformBlockCase::iterate (void)
{
	TestLog&				log				= m_testCtx.getLog();
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	UniformLayout			refLayout;		//!< std140 layout.
	vector<deUint8>			data;			//!< Data.
	map<int, void*>			blockPointers;	//!< Reference block pointers.

	// Initialize result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Compute reference layout.
	computeStd140Layout(refLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (vector<BlockLayoutEntry>::const_iterator blockIter = refLayout.blocks.begin(); blockIter != refLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)refLayout.blocks.size(); blockNdx++)
		{
			blockPointers[blockNdx] = &data[0] + curOffset;
			curOffset += refLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(refLayout, blockPointers, 1 /* seed */);

	// Generate shaders and build program.
	std::ostringstream vtxSrc;
	std::ostringstream fragSrc;

	generateVertexShader(vtxSrc, m_glslVersion, m_interface, refLayout, blockPointers);
	generateFragmentShader(fragSrc, m_glslVersion, m_interface, refLayout, blockPointers);

	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(vtxSrc.str(), fragSrc.str()));
	log << program;

	if (!program.isOk())
	{
		// Compile failed.
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Query layout from GL.
	UniformLayout glLayout;
	getGLUniformLayout(gl, glLayout, program.getProgram());

	// Print layout to log.
	log << TestLog::Section("ActiveUniformBlocks", "Active Uniform Blocks");
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
		log << TestLog::Message << blockNdx << ": " << glLayout.blocks[blockNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	log << TestLog::Section("ActiveUniforms", "Active Uniforms");
	for (int uniformNdx = 0; uniformNdx < (int)glLayout.uniforms.size(); uniformNdx++)
		log << TestLog::Message << uniformNdx << ": " << glLayout.uniforms[uniformNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	// Check that we can even try rendering with given layout.
	if (!checkLayoutIndices(glLayout) || !checkLayoutBounds(glLayout) || !compareTypes(refLayout, glLayout))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid layout");
		return STOP; // It is not safe to use the given layout.
	}

	// Verify all std140 blocks.
	if (!compareStd140Blocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid std140 layout");

	// Verify all shared blocks - all uniforms should be active, and certain properties match.
	if (!compareSharedBlocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid shared layout");

	// Check consistency with index queries
	if (!checkIndexQueries(program.getProgram(), glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsintent block index query results");

	// Use program.
	gl.useProgram(program.getProgram());

	// Assign binding points to all active uniform blocks.
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
	{
		deUint32 binding = (deUint32)blockNdx; // \todo [2012-01-25 pyry] Randomize order?
		gl.uniformBlockBinding(program.getProgram(), (deUint32)blockNdx, binding);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set uniform block bindings");

	// Allocate buffers, write data and bind to targets.
	UniformBufferManager bufferManager(m_renderCtx);
	if (m_bufferMode == BUFFERMODE_PER_BLOCK)
	{
		int							numBlocks			= (int)glLayout.blocks.size();
		vector<vector<deUint8> >	glData				(numBlocks);
		map<int, void*>				glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			glData[blockNdx].resize(glLayout.blocks[blockNdx].size);
			glBlockPointers[blockNdx] = &glData[blockNdx][0];
		}

		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32	buffer	= bufferManager.allocBuffer();
			deUint32	binding	= (deUint32)blockNdx;

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData[blockNdx].size(), &glData[blockNdx][0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, binding, buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase(GL_UNIFORM_BUFFER) failed");
		}
	}
	else
	{
		DE_ASSERT(m_bufferMode == BUFFERMODE_SINGLE);

		int				totalSize			= 0;
		int				curOffset			= 0;
		int				numBlocks			= (int)glLayout.blocks.size();
		int				bindingAlignment	= 0;
		map<int, int>	glBlockOffsets;

		gl.getIntegerv(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT, &bindingAlignment);

		// Compute total size and offsets.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			if (bindingAlignment > 0)
				curOffset = deRoundUp32(curOffset, bindingAlignment);
			glBlockOffsets[blockNdx] = curOffset;
			curOffset += glLayout.blocks[blockNdx].size;
		}
		totalSize = curOffset;

		// Assign block pointers.
		vector<deUint8>	glData(totalSize);
		map<int, void*>	glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			glBlockPointers[blockNdx] = &glData[glBlockOffsets[blockNdx]];

		// Copy to gl format.
		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		// Allocate buffer and upload data.
		deUint32 buffer = bufferManager.allocBuffer();
		gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
		if (!glData.empty())
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData.size(), &glData[0], GL_STATIC_DRAW);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

		// Bind ranges to binding points.
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 binding = (deUint32)blockNdx;
			gl.bindBufferRange(GL_UNIFORM_BUFFER, binding, buffer, (glw::GLintptr)glBlockOffsets[blockNdx], (glw::GLsizeiptr)glLayout.blocks[blockNdx].size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange(GL_UNIFORM_BUFFER) failed");
		}
	}

	bool renderOk = render(program.getProgram());
	if (!renderOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");

	return STOP;
}